

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O2

int __thiscall
ADPlanner::replan(ADPlanner *this,double allocated_time_secs,
                 vector<int,_std::allocator<int>_> *solution_stateIDs_V,int *psolcost)

{
  uint uVar1;
  int PathCost;
  vector<int,_std::allocator<int>_> pathIds;
  int local_3c;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c = 0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *psolcost = 0;
  uVar1 = (*(this->super_SBPLPlanner)._vptr_SBPLPlanner[0x35])
                    (this,this->pSearchStateSpace_,&local_38,&local_3c,
                     (ulong)this->bsearchuntilfirstsolution,0);
  std::vector<int,_std::allocator<int>_>::operator=
            (solution_stateIDs_V,(vector<int,_std::allocator<int>_> *)&local_38);
  *psolcost = local_3c;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  return uVar1 & 0xff;
}

Assistant:

int ADPlanner::replan(double allocated_time_secs, vector<int>* solution_stateIDs_V, int* psolcost)
{
    vector<int> pathIds;
    int PathCost = 0;
    bool bFound = false;
    *psolcost = 0;
    bool bOptimalSolution = false;

    SBPL_PRINTF("planner: replan called (bFirstSol=%d, bOptSol=%d)\n", bsearchuntilfirstsolution, bOptimalSolution);

    //plan for the first solution only
    bFound = Search(pSearchStateSpace_, pathIds, PathCost, bsearchuntilfirstsolution, bOptimalSolution, allocated_time_secs);
    if (!bFound) {
        SBPL_PRINTF("failed to find a solution\n");
    }

    //copy the solution
    *solution_stateIDs_V = pathIds;
    *psolcost = PathCost;

    return (int)bFound;
}